

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderStartCountdown(CHud *this)

{
  IGraphics *pIVar1;
  ITextRender *pIVar2;
  CGameClient *pCVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  char aBuf [32];
  char acStack_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateFlags & 0x20) != 0)
  {
    if (RenderStartCountdown()::s_LabelCursor == '\0') {
      iVar5 = __cxa_guard_acquire(&RenderStartCountdown()::s_LabelCursor);
      if (iVar5 != 0) {
        CTextCursor::CTextCursor(&RenderStartCountdown::s_LabelCursor,20.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderStartCountdown::s_LabelCursor,&__dso_handle);
        __cxa_guard_release(&RenderStartCountdown()::s_LabelCursor);
      }
    }
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderStartCountdown::s_LabelCursor.m_CursorPos.field_0.x =
         ((float)pIVar1->m_ScreenWidth / (float)pIVar1->m_ScreenHeight) * 150.0;
    RenderStartCountdown::s_LabelCursor.m_CursorPos.field_1.y = 50.0;
    RenderStartCountdown::s_LabelCursor.m_Align = 1;
    pcVar6 = Localize("Game starts in","");
    CTextCursor::Reset(&RenderStartCountdown::s_LabelCursor,(long)g_Localization.m_CurrentVersion);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderStartCountdown::s_LabelCursor,pcVar6,0xffffffff);
    if (((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateEndTick != 0) {
      if (RenderStartCountdown()::s_Cursor == '\0') {
        iVar5 = __cxa_guard_acquire(&RenderStartCountdown()::s_Cursor);
        if (iVar5 != 0) {
          CTextCursor::CTextCursor(&RenderStartCountdown::s_Cursor,16.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderStartCountdown::s_Cursor,&__dso_handle);
          __cxa_guard_release(&RenderStartCountdown()::s_Cursor);
        }
      }
      pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      RenderStartCountdown::s_Cursor.m_CursorPos.field_0.x =
           ((float)pIVar1->m_ScreenWidth / (float)pIVar1->m_ScreenHeight) * 150.0;
      RenderStartCountdown::s_Cursor.m_CursorPos.field_1.y = 75.0;
      RenderStartCountdown::s_Cursor.m_Align = 1;
      pCVar3 = (this->super_CComponent).m_pClient;
      uVar4 = ((((pCVar3->m_Snap).m_pGameData)->m_GameStateEndTick -
               pCVar3->m_pClient->m_CurGameTick) + 0x31) / 0x32;
      str_format(acStack_48,0x20,"%d",(ulong)uVar4);
      CTextCursor::Reset(&RenderStartCountdown::s_Cursor,(long)(int)uVar4);
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
                (pIVar2,&RenderStartCountdown::s_Cursor,acStack_48,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderStartCountdown()
{
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_STARTCOUNTDOWN)
	{
		static CTextCursor s_LabelCursor(20.0f);
		s_LabelCursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
		s_LabelCursor.m_Align = TEXTALIGN_TC;

		const char *pText = Localize("Game starts in");

		s_LabelCursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_LabelCursor, pText, -1);

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
			return;

		static CTextCursor s_Cursor(16.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 75);
		s_Cursor.m_Align = TEXTALIGN_TC;

		char aBuf[32];
		int Seconds = (m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick()+SERVER_TICK_SPEED-1)/SERVER_TICK_SPEED;
		str_format(aBuf, sizeof(aBuf), "%d", Seconds);
		
		s_Cursor.Reset(Seconds);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}